

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IGeneratorsForTest * __thiscall Catch::Context::findGeneratorsForCurrentTest(Context *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppVar3;
  IGeneratorsForTest *local_80;
  iterator local_60;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>
  local_58 [3];
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>
  local_38;
  const_iterator it;
  string testName;
  Context *this_local;
  
  iVar2 = (*(this->super_IMutableContext).super_IContext._vptr_IContext[2])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x60))();
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>_>
       ::find(&this->m_generatorsByTestName,(key_type *)&it);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>
  ::_Rb_tree_const_iterator(&local_38,&local_40);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>_>
       ::end(&this->m_generatorsByTestName);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>
  ::_Rb_tree_const_iterator(local_58,&local_60);
  bVar1 = std::operator!=(&local_38,local_58);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>
             ::operator->(&local_38);
    local_80 = ppVar3->second;
  }
  else {
    local_80 = (IGeneratorsForTest *)0x0;
  }
  std::__cxx11::string::~string((string *)&it);
  return local_80;
}

Assistant:

IGeneratorsForTest* findGeneratorsForCurrentTest() {
            std::string testName = getResultCapture().getCurrentTestName();

            std::map<std::string, IGeneratorsForTest*>::const_iterator it =
            m_generatorsByTestName.find( testName );
            return it != m_generatorsByTestName.end()
            ? it->second
            : NULL;
        }